

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

UBool u_strHasMoreChar32Than_63(UChar *s,int32_t length,int32_t number)

{
  UChar UVar1;
  UChar *pUVar2;
  int iVar3;
  int iVar4;
  UChar *pUVar5;
  
  if (number < 0) {
    return '\x01';
  }
  if (-2 < length && s != (UChar *)0x0) {
    if (length == -1) {
      UVar1 = *s;
      if (UVar1 != L'\0') {
        iVar3 = number + 1;
        do {
          iVar3 = iVar3 + -1;
          if (iVar3 == 0) {
            return '\x01';
          }
          pUVar5 = s + 1;
          if (((UVar1 & 0xfc00U) == 0xd800) && ((s[1] & 0xfc00U) == 0xdc00)) {
            pUVar5 = s + 2;
          }
          UVar1 = *pUVar5;
          s = pUVar5;
        } while (UVar1 != L'\0');
      }
    }
    else {
      if ((uint)number < length + 1U >> 1) {
        return '\x01';
      }
      iVar3 = length - number;
      if ((iVar3 != 0 && number <= length) && (length != 0)) {
        pUVar5 = s + (uint)length;
        iVar4 = number + 1;
        do {
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) {
            return '\x01';
          }
          pUVar2 = s + 1;
          if ((pUVar2 != pUVar5 && (*s & 0xfc00U) == 0xd800) && ((*pUVar2 & 0xfc00U) == 0xdc00)) {
            if (iVar3 < 2) {
              return '\0';
            }
            iVar3 = iVar3 + -1;
            pUVar2 = s + 2;
          }
          s = pUVar2;
        } while (s != pUVar5);
        return '\0';
      }
    }
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
u_strHasMoreChar32Than(const UChar *s, int32_t length, int32_t number) {

    if(number<0) {
        return TRUE;
    }
    if(s==NULL || length<-1) {
        return FALSE;
    }

    if(length==-1) {
        /* s is NUL-terminated */
        UChar c;

        /* count code points until they exceed */
        for(;;) {
            if((c=*s++)==0) {
                return FALSE;
            }
            if(number==0) {
                return TRUE;
            }
            if(U16_IS_LEAD(c) && U16_IS_TRAIL(*s)) {
                ++s;
            }
            --number;
        }
    } else {
        /* length>=0 known */
        const UChar *limit;
        int32_t maxSupplementary;

        /* s contains at least (length+1)/2 code points: <=2 UChars per cp */
        if(((length+1)/2)>number) {
            return TRUE;
        }

        /* check if s does not even contain enough UChars */
        maxSupplementary=length-number;
        if(maxSupplementary<=0) {
            return FALSE;
        }
        /* there are maxSupplementary=length-number more UChars than asked-for code points */

        /*
         * count code points until they exceed and also check that there are
         * no more than maxSupplementary supplementary code points (UChar pairs)
         */
        limit=s+length;
        for(;;) {
            if(s==limit) {
                return FALSE;
            }
            if(number==0) {
                return TRUE;
            }
            if(U16_IS_LEAD(*s++) && s!=limit && U16_IS_TRAIL(*s)) {
                ++s;
                if(--maxSupplementary<=0) {
                    /* too many pairs - too few code points */
                    return FALSE;
                }
            }
            --number;
        }
    }
}